

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O2

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  char **ppcVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint __c;
  byte bVar9;
  
  if ((prev_argv != ___argv) || (prev_argc != ___argc)) {
    argv_index = 1;
    argv_index2 = 1;
    opt_offset = 1;
    nonopt = 0;
    dashdash = 0;
    prev_argv = ___argv;
    prev_argc = ___argc;
  }
  ppcVar5 = prev_argv;
  uVar8 = argv_index;
  bVar9 = dashdash;
  while( true ) {
    iVar1 = nonopt;
    optarg = (char *)0x0;
    lVar7 = (long)(int)uVar8;
    pcVar2 = ___argv[lVar7];
    if (pcVar2 == (char *)0x0) break;
    if (((*pcVar2 == '-') && (pcVar2[1] == '-')) && (pcVar2[2] == '\0')) {
      dashdash = 1;
      increment_index();
      lVar7 = (long)argv_index;
      pcVar2 = ___argv[lVar7];
      bVar9 = 1;
      uVar8 = argv_index;
      if (pcVar2 == (char *)0x0) break;
    }
    else if ((bVar9 & 1) == 0) {
      if ((*pcVar2 == '-') && (pcVar2[1] != '\0')) {
        lVar3 = (long)opt_offset;
        lVar7 = lVar3 + 1;
        opt_offset = (int)lVar7;
        __c = (uint)pcVar2[lVar3];
        pcVar4 = strchr(__shortopts + (*__shortopts == '-'),__c);
        if (pcVar4 == (char *)0x0) {
          if (opterr != 0) {
            fprintf(_stderr,"%s: invalid option -- %c\n",*___argv,(ulong)__c);
          }
          optopt = __c;
          increment_index();
          uVar6 = 0x3f;
          goto LAB_0010798b;
        }
        uVar6 = __c;
        if (pcVar4[1] != ':') {
          if (pcVar2[lVar7] == '\0') {
            increment_index();
          }
          goto LAB_0010798b;
        }
        if (pcVar2[lVar7] != '\0') {
          optarg = pcVar2 + lVar7;
          goto LAB_00107a97;
        }
        if (pcVar4[2] == ':') goto LAB_00107a97;
        if ((int)uVar8 < argv_index2) {
          uVar8 = argv_index2;
        }
        ppcVar5 = ___argv + (int)uVar8;
        goto LAB_00107a60;
      }
      bVar9 = 0;
    }
    else {
      bVar9 = 1;
    }
    if (*__shortopts == '+') {
LAB_00107962:
      nonopt = ___argc - uVar8;
      break;
    }
    if (*__shortopts == '-') {
      optarg = pcVar2;
      increment_index();
      uVar6 = 1;
      goto LAB_0010798b;
    }
    pcVar2 = getenv("POSIXLY_CORRECT");
    if (pcVar2 != (char *)0x0) goto LAB_00107962;
    if (___argc <= (int)(iVar1 + uVar8)) break;
    pcVar2 = ppcVar5[lVar7];
    memmove(ppcVar5 + lVar7,ppcVar5 + lVar7 + 1,(long)(int)(~uVar8 + ___argc) << 3);
    ppcVar5[(long)___argc + -1] = pcVar2;
    nonopt = iVar1 + 1;
  }
  uVar6 = 0xffffffff;
  goto LAB_0010798b;
  while (*pcVar2 == '-') {
LAB_00107a60:
    uVar8 = uVar8 + 1;
    ppcVar5 = ppcVar5 + 1;
    pcVar2 = *ppcVar5;
    if (pcVar2 == (char *)0x0) break;
  }
  optarg = (char *)0x0;
  argv_index2 = uVar8;
  if ((int)(iVar1 + uVar8) < ___argc) {
    optarg = pcVar2;
  }
LAB_00107a97:
  increment_index();
  if (((optarg == (char *)0x0) && (pcVar4[2] != ':')) && (uVar6 = 0x3f, optopt = __c, opterr != 0))
  {
    fprintf(_stderr,"%s: option requires an argument -- %c\n",*___argv,(ulong)__c);
  }
LAB_0010798b:
  optind = argv_index;
  if (uVar6 == 0xffffffff) {
    optind = ___argc - nonopt;
  }
  return uVar6;
}

Assistant:

int getopt(int argc, char** argv, const char* optstr)
{
	int c = 0;

	/* If we have new argv, reinitialize */
	if(prev_argv != argv || prev_argc != argc)
	{
		/* Initialize variables */
		prev_argv = argv;
		prev_argc = argc;
		argv_index = 1;
		argv_index2 = 1;
		opt_offset = 1;
		dashdash = 0;
		nonopt = 0;
	}

	/* Jump point in case we want to ignore the current argv_index */
	getopt_top:

	/* Misc. initializations */
	optarg = NULL;

	/* Dash-dash check */
	if(argv[argv_index] && !strcmp(argv[argv_index], "--"))
	{
		dashdash = 1;
		increment_index();
	}

	/* If we're at the end of argv, that's it. */
	if(argv[argv_index] == NULL)
	{
		c = -1;
	}
	/* Are we looking at a string? Single dash is also a string */
	else if(dashdash || argv[argv_index][0] != '-' || !strcmp(argv[argv_index], "-"))
	{
		/* If we want a string... */
		if(optstr[0] == '-')
		{
			c = 1;
			optarg = argv[argv_index];
			increment_index();
		}
		/* If we really don't want it (we're in POSIX mode), we're done */
		else if(optstr[0] == '+' || getenv("POSIXLY_CORRECT"))
		{
			c = -1;

			/* Everything else is a non-opt argument */
			nonopt = argc - argv_index;
		}
		/* If we mildly don't want it, then move it back */
		else
		{
			if(!permute_argv_once()) goto getopt_top;
			else c = -1;
		}
	}
	/* Otherwise we're looking at an option */
	else
	{
		char* opt_ptr = NULL;

		/* Grab the option */
		c = argv[argv_index][opt_offset++];

		/* Is the option in the optstr? */
		if(optstr[0] == '-') opt_ptr = strchr(optstr+1, c);
		else opt_ptr = strchr(optstr, c);
		/* Invalid argument */
		if(!opt_ptr)
		{
			if(opterr)
			{
				fprintf(stderr, "%s: invalid option -- %c\n", argv[0], c);
			}

			optopt = c;
			c = '?';

			/* Move onto the next option */
			increment_index();
		}
		/* Option takes argument */
		else if(opt_ptr[1] == ':')
		{
			/* ie, -oARGUMENT, -xxxoARGUMENT, etc. */
			if(argv[argv_index][opt_offset] != '\0')
			{
				optarg = &argv[argv_index][opt_offset];
				increment_index();
			}
			/* ie, -o ARGUMENT (only if it's a required argument) */
			else if(opt_ptr[2] != ':')
			{
				/* One of those "you're not expected to understand this" moment */
				if(argv_index2 < argv_index) argv_index2 = argv_index;
				while(argv[++argv_index2] && argv[argv_index2][0] == '-');
				optarg = argv[argv_index2];

				/* Don't cross into the non-option argument list */
				if(argv_index2 + nonopt >= prev_argc) optarg = NULL;

				/* Move onto the next option */
				increment_index();
			}
			else
			{
				/* Move onto the next option */
				increment_index();
			}

			/* In case we got no argument for an option with required argument */
			if(optarg == NULL && opt_ptr[2] != ':')
			{
				optopt = c;
				c = '?';

				if(opterr)
				{
					fprintf(stderr,"%s: option requires an argument -- %c\n",
							argv[0], optopt);
				}
			}
		}
		/* Option does not take argument */
		else
		{
			/* Next argv_index */
			if(argv[argv_index][opt_offset] == '\0')
			{
				increment_index();
			}
		}
	}

	/* Calculate optind */
	if(c == -1)
	{
		optind = argc - nonopt;
	}
	else
	{
		optind = argv_index;
	}

	return c;
}